

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmMakeReady(jx9_vm *pVm)

{
  sxi32 sVar1;
  jx9_value *pjVar2;
  sxi32 rc;
  jx9_vm *pVm_local;
  
  if (pVm->nMagic == 0xea12cd72) {
    pVm->nMagic = 0xba851227;
    jx9ResetCodeGenerator(pVm,(ProcConsumer)0x0,(void *)0x0);
    sVar1 = jx9VmEmitInstr(pVm,1,0,0,(void *)0x0,(sxu32 *)0x0);
    if (sVar1 == 0) {
      jx9MemObjInit(pVm,&pVm->sExec);
      pjVar2 = VmNewOperandStack(pVm,pVm->pByteContainer->nUsed);
      pVm->aOps = pjVar2;
      if (pVm->aOps == (jx9_value *)0x0) {
        pVm_local._4_4_ = -1;
      }
      else {
        (pVm->sVmConsumer).xConsumer = jx9VmBlobConsumer;
        (pVm->sVmConsumer).pUserData = &pVm->sConsumer;
        pVm_local._4_4_ = VmRegisterSpecialFunction(pVm);
        if ((pVm_local._4_4_ == 0) &&
           (pVm_local._4_4_ = jx9HashmapLoadBuiltin(pVm), pVm_local._4_4_ == 0)) {
          jx9RegisterBuiltInConstant(pVm);
          jx9RegisterBuiltInFunction(pVm);
          pVm_local._4_4_ = 0;
        }
      }
    }
    else {
      pVm_local._4_4_ = -1;
    }
  }
  else {
    pVm_local._4_4_ = -0x18;
  }
  return pVm_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmMakeReady(
	jx9_vm *pVm /* Target VM */
	)
{
	sxi32 rc;
	if( pVm->nMagic != JX9_VM_INIT ){
		/* Initialize your VM first */
		return SXERR_CORRUPT;
	}
	/* Mark the VM ready for bytecode execution */
	pVm->nMagic = JX9_VM_RUN; 
	/* Release the code generator now we have compiled our program */
	jx9ResetCodeGenerator(pVm, 0, 0);
	/* Emit the DONE instruction */
	rc = jx9VmEmitInstr(&(*pVm), JX9_OP_DONE, 0, 0, 0, 0);
	if( rc != SXRET_OK ){
		return SXERR_MEM;
	}
	/* Script return value */
	jx9MemObjInit(&(*pVm), &pVm->sExec); /* Assume a NULL return value */
	/* Allocate a new operand stack */	
	pVm->aOps = VmNewOperandStack(&(*pVm), SySetUsed(pVm->pByteContainer));
	if( pVm->aOps == 0 ){
		return SXERR_MEM;
	}
	/* Set the default VM output consumer callback and it's 
	 * private data. */
	pVm->sVmConsumer.xConsumer = jx9VmBlobConsumer;
	pVm->sVmConsumer.pUserData = &pVm->sConsumer;
	/* Register special functions first [i.e: print, func_get_args(), die, etc.] */
	rc = VmRegisterSpecialFunction(&(*pVm));
	if( rc != SXRET_OK ){
		/* Don't worry about freeing memory, everything will be released shortly */
		return rc;
	}
	/* Create superglobals [i.e: $GLOBALS, $_GET, $_POST...] */
	rc = jx9HashmapLoadBuiltin(&(*pVm));
	if( rc != SXRET_OK ){
		/* Don't worry about freeing memory, everything will be released shortly */
		return rc;
	}
	/* Register built-in constants [i.e: JX9_EOL, JX9_OS...] */
	jx9RegisterBuiltInConstant(&(*pVm));
	/* Register built-in functions [i.e: is_null(), array_diff(), strlen(), etc.] */
	jx9RegisterBuiltInFunction(&(*pVm));
	/* VM is ready for bytecode execution */
	return SXRET_OK;
}